

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

bool __thiscall
glcts::GeometryShaderMaxUniformComponentsTest::verifyResult
          (GeometryShaderMaxUniformComponentsTest *this,void *data)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  MessageBuilder local_1b0;
  int *local_30;
  GLint *transform_feedback_data;
  void *pvStack_20;
  GLint expected_data;
  void *data_local;
  GeometryShaderMaxUniformComponentsTest *this_local;
  
  transform_feedback_data._4_4_ =
       ((this->m_max_uniform_components + 1) * this->m_max_uniform_components) / 2;
  local_30 = (int *)data;
  pvStack_20 = data;
  data_local = this;
  iVar1 = memcmp(data,(void *)((long)&transform_feedback_data + 4),4);
  if (iVar1 != 0) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.
                         super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [25])"Wrong result! Expected: ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)((long)&transform_feedback_data + 4));
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])" Extracted: ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_30);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return iVar1 == 0;
}

Assistant:

bool GeometryShaderMaxUniformComponentsTest::verifyResult(const void* data)
{
	/* Expected data, sum of elements in range <x;y> with length n = ((x + y) / 2) * n */
	const glw::GLint expected_data = ((1 + m_max_uniform_components) * m_max_uniform_components) / 2;

	/* Cast to const GLint */
	const glw::GLint* transform_feedback_data = (const glw::GLint*)data;

	/* Verify data extracted from transfrom feedback */
	if (0 != memcmp(transform_feedback_data, &expected_data, m_buffer_size))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Wrong result! Expected: " << expected_data
						   << " Extracted: " << *transform_feedback_data << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		return true;
	}
}